

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256_tests.cpp
# Opt level: O2

void __thiscall arith_uint256_tests::shifts::test_method(shifts *this)

{
  readonly_property65 rVar1;
  bool bVar2;
  uint uVar3;
  undefined8 in_RCX;
  uint i;
  uint shift;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  uint arrayLength;
  int iVar6;
  int iVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  check_type cVar8;
  int local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 local_390 [16];
  undefined1 *local_380;
  char **local_378;
  assertion_result local_370;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined1 local_f8 [8];
  element_type *local_f0;
  shared_count asStack_e8 [2];
  undefined1 local_d8 [8];
  element_type *local_d0;
  shared_count sStack_c8;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_c0;
  arith_uint256 c2L;
  arith_uint256 c1L;
  arith_uint256 TmpL;
  uchar TmpArray [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint<256U>::base_uint(&TmpL.super_base_uint<256U>);
  shift = 0xff;
  for (arrayLength = 0; arrayLength != 0x100; arrayLength = arrayLength + 1) {
    shiftArrayLeft(TmpArray,OneArray,arrayLength,(uint)in_RCX);
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_100 = "";
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0xa7;
    file.m_begin = (iterator)&local_108;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_390,TmpArray,
               (uchar *)&local_38,(allocator_type *)&local_3a0);
    arith_uint256V((arith_uint256 *)&c1L.super_base_uint<256U>,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_390);
    ::operator<<(&c2L.super_base_uint<256U>,(base_uint<256U> *)&OneL,arrayLength);
    rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         ::operator==(&c1L.super_base_uint<256U>,&c2L.super_base_uint<256U>);
    local_f8[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
    local_f0 = (element_type *)0x0;
    asStack_e8[0].pi_ = (sp_counted_base *)0x0;
    local_370._0_8_ =
         "arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (OneL << i)";
    local_370.m_message.px = (element_type *)0xb6b8b2;
    local_d0 = (element_type *)((ulong)local_d0 & 0xffffffffffffff00);
    local_d8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
    sStack_c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_c0 = (vector<unsigned_char,std::allocator<unsigned_char>> *)&local_370;
    local_128 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_120 = "";
    pvVar4 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_f8,(lazy_ostream *)local_d8,1,0,WARN,_cVar8,
               (size_t)&local_128,0xa7);
    boost::detail::shared_count::~shared_count(asStack_e8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_390);
    base_uint<256U>::operator=(&TmpL.super_base_uint<256U>,(base_uint<256U> *)&OneL);
    base_uint<256U>::operator<<=(&TmpL.super_base_uint<256U>,arrayLength);
    local_138 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_130 = "";
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    local_140 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0xa9;
    file_00.m_begin = (iterator)&local_138;
    msg_00.m_end = pvVar5;
    msg_00.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_148,
               msg_00);
    ::operator<<(&c1L.super_base_uint<256U>,(base_uint<256U> *)&OneL,arrayLength);
    bVar2 = ::operator==(&TmpL.super_base_uint<256U>,&c1L.super_base_uint<256U>);
    local_d8[0] = bVar2;
    local_d0 = (element_type *)0x0;
    sStack_c8.pi_ = (sp_counted_base *)0x0;
    local_f8 = (undefined1  [8])0xb6b8b3;
    local_f0 = (element_type *)0xb6b8c6;
    c2L.super_base_uint<256U>.pn[2]._0_1_ = 0;
    c2L.super_base_uint<256U>.pn._0_8_ = &PTR__lazy_ostream_011481f0;
    c2L.super_base_uint<256U>.pn._16_8_ = boost::unit_test::lazy_ostream::inst;
    c2L.super_base_uint<256U>.pn._24_8_ = local_f8;
    local_158 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_150 = "";
    pvVar4 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_d8,(lazy_ostream *)&c2L,1,0,WARN,_cVar8,(size_t)&local_158,
               0xa9);
    boost::detail::shared_count::~shared_count(&sStack_c8);
    local_168 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_160 = "";
    local_178 = &boost::unit_test::basic_cstring<char_const>::null;
    local_170 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0xaa;
    file_01.m_begin = (iterator)&local_168;
    msg_01.m_end = pvVar5;
    msg_01.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_178,
               msg_01);
    ::operator>>(&c1L.super_base_uint<256U>,(base_uint<256U> *)&HalfL,shift);
    ::operator<<(&c2L.super_base_uint<256U>,(base_uint<256U> *)&OneL,arrayLength);
    rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         ::operator==(&c1L.super_base_uint<256U>,&c2L.super_base_uint<256U>);
    local_f8[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
    local_f0 = (element_type *)0x0;
    asStack_e8[0].pi_ = (sp_counted_base *)0x0;
    local_390._0_8_ = "(HalfL >> (255-i)) == (OneL << i)";
    local_390._8_8_ = "";
    local_d0 = (element_type *)((ulong)local_d0 & 0xffffffffffffff00);
    local_d8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
    sStack_c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_188 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_180 = "";
    pvVar4 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    local_c0 = (vector<unsigned_char,std::allocator<unsigned_char>> *)local_390;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_f8,(lazy_ostream *)local_d8,1,0,WARN,_cVar8,
               (size_t)&local_188,0xaa);
    boost::detail::shared_count::~shared_count(asStack_e8);
    base_uint<256U>::operator=(&TmpL.super_base_uint<256U>,(base_uint<256U> *)&HalfL);
    base_uint<256U>::operator>>=(&TmpL.super_base_uint<256U>,shift);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_190 = "";
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0xac;
    file_02.m_begin = (iterator)&local_198;
    msg_02.m_end = pvVar5;
    msg_02.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1a8,
               msg_02);
    ::operator<<(&c1L.super_base_uint<256U>,(base_uint<256U> *)&OneL,arrayLength);
    bVar2 = ::operator==(&TmpL.super_base_uint<256U>,&c1L.super_base_uint<256U>);
    local_d8[0] = bVar2;
    local_d0 = (element_type *)0x0;
    sStack_c8.pi_ = (sp_counted_base *)0x0;
    local_f8 = (undefined1  [8])0xb6b8b3;
    local_f0 = (element_type *)0xb6b8c6;
    c2L.super_base_uint<256U>.pn[2]._0_1_ = 0;
    c2L.super_base_uint<256U>.pn._0_8_ = &PTR__lazy_ostream_011481f0;
    c2L.super_base_uint<256U>.pn._16_8_ = boost::unit_test::lazy_ostream::inst;
    c2L.super_base_uint<256U>.pn._24_8_ = local_f8;
    local_1b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_1b0 = "";
    pvVar4 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    uVar3 = 0xac;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_d8,(lazy_ostream *)&c2L,1,0,WARN,_cVar8,(size_t)&local_1b8,
               0xac);
    boost::detail::shared_count::~shared_count(&sStack_c8);
    shiftArrayLeft(TmpArray,&R1Array,arrayLength,uVar3);
    local_1c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_1c0 = "";
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0xaf;
    file_03.m_begin = (iterator)&local_1c8;
    msg_03.m_end = pvVar5;
    msg_03.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1d8,
               msg_03);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_390,TmpArray,
               (uchar *)&local_38,(allocator_type *)&local_3a0);
    arith_uint256V((arith_uint256 *)&c1L.super_base_uint<256U>,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_390);
    ::operator<<(&c2L.super_base_uint<256U>,(base_uint<256U> *)&R1L,arrayLength);
    rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         ::operator==(&c1L.super_base_uint<256U>,&c2L.super_base_uint<256U>);
    local_f8[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
    local_f0 = (element_type *)0x0;
    asStack_e8[0].pi_ = (sp_counted_base *)0x0;
    local_370._0_8_ =
         "arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (R1L << i)";
    local_370.m_message.px = (element_type *)0xb6b937;
    local_d0 = (element_type *)((ulong)local_d0 & 0xffffffffffffff00);
    local_d8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
    sStack_c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_c0 = (vector<unsigned_char,std::allocator<unsigned_char>> *)&local_370;
    local_1e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_1e0 = "";
    pvVar4 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_f8,(lazy_ostream *)local_d8,1,0,WARN,_cVar8,
               (size_t)&local_1e8,0xaf);
    boost::detail::shared_count::~shared_count(asStack_e8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_390);
    base_uint<256U>::operator=(&TmpL.super_base_uint<256U>,(base_uint<256U> *)&R1L);
    base_uint<256U>::operator<<=(&TmpL.super_base_uint<256U>,arrayLength);
    local_1f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_1f0 = "";
    local_208 = &boost::unit_test::basic_cstring<char_const>::null;
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0xb1;
    file_04.m_begin = (iterator)&local_1f8;
    msg_04.m_end = pvVar5;
    msg_04.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_208,
               msg_04);
    ::operator<<(&c1L.super_base_uint<256U>,(base_uint<256U> *)&R1L,arrayLength);
    bVar2 = ::operator==(&TmpL.super_base_uint<256U>,&c1L.super_base_uint<256U>);
    local_d8[0] = bVar2;
    local_d0 = (element_type *)0x0;
    sStack_c8.pi_ = (sp_counted_base *)0x0;
    local_f8 = (undefined1  [8])0xb6b938;
    local_f0 = (element_type *)0xb6b94a;
    c2L.super_base_uint<256U>.pn[2]._0_1_ = 0;
    c2L.super_base_uint<256U>.pn._0_8_ = &PTR__lazy_ostream_011481f0;
    c2L.super_base_uint<256U>.pn._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_218 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_210 = "";
    pvVar4 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    uVar3 = 0xb1;
    c2L.super_base_uint<256U>.pn._24_8_ = (assertion_result *)local_f8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_d8,(lazy_ostream *)&c2L,1,0,WARN,_cVar8,(size_t)&local_218,
               0xb1);
    boost::detail::shared_count::~shared_count(&sStack_c8);
    shiftArrayRight(TmpArray,&R1Array,arrayLength,uVar3);
    local_228 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_220 = "";
    local_238 = &boost::unit_test::basic_cstring<char_const>::null;
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0xb4;
    file_05.m_begin = (iterator)&local_228;
    msg_05.m_end = pvVar5;
    msg_05.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_238,
               msg_05);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_390,TmpArray,
               (uchar *)&local_38,(allocator_type *)&local_3a0);
    arith_uint256V((arith_uint256 *)&c1L.super_base_uint<256U>,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_390);
    ::operator>>(&c2L.super_base_uint<256U>,(base_uint<256U> *)&R1L,arrayLength);
    rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         ::operator==(&c1L.super_base_uint<256U>,&c2L.super_base_uint<256U>);
    local_f8[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
    local_f0 = (element_type *)0x0;
    asStack_e8[0].pi_ = (sp_counted_base *)0x0;
    local_370._0_8_ =
         "arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (R1L >> i)";
    local_370.m_message.px = (element_type *)0xb6b999;
    local_d0 = (element_type *)((ulong)local_d0 & 0xffffffffffffff00);
    local_d8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
    sStack_c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_c0 = (vector<unsigned_char,std::allocator<unsigned_char>> *)&local_370;
    local_248 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_240 = "";
    pvVar4 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_f8,(lazy_ostream *)local_d8,1,0,WARN,_cVar8,
               (size_t)&local_248,0xb4);
    boost::detail::shared_count::~shared_count(asStack_e8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_390);
    base_uint<256U>::operator=(&TmpL.super_base_uint<256U>,(base_uint<256U> *)&R1L);
    base_uint<256U>::operator>>=(&TmpL.super_base_uint<256U>,arrayLength);
    local_258 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_250 = "";
    local_268 = &boost::unit_test::basic_cstring<char_const>::null;
    local_260 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0xb6;
    file_06.m_begin = (iterator)&local_258;
    msg_06.m_end = pvVar5;
    msg_06.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_268,
               msg_06);
    ::operator>>(&c1L.super_base_uint<256U>,(base_uint<256U> *)&R1L,arrayLength);
    bVar2 = ::operator==(&TmpL.super_base_uint<256U>,&c1L.super_base_uint<256U>);
    local_d8[0] = bVar2;
    local_d0 = (element_type *)0x0;
    sStack_c8.pi_ = (sp_counted_base *)0x0;
    local_f8 = (undefined1  [8])0xb6b99a;
    local_f0 = (element_type *)0xb6b9ac;
    c2L.super_base_uint<256U>.pn[2]._0_1_ = 0;
    c2L.super_base_uint<256U>.pn._0_8_ = &PTR__lazy_ostream_011481f0;
    c2L.super_base_uint<256U>.pn._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_278 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_270 = "";
    pvVar4 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    uVar3 = 0xb6;
    c2L.super_base_uint<256U>.pn._24_8_ = (assertion_result *)local_f8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_d8,(lazy_ostream *)&c2L,1,0,WARN,_cVar8,(size_t)&local_278,
               0xb6);
    boost::detail::shared_count::~shared_count(&sStack_c8);
    shiftArrayLeft(TmpArray,&MaxArray,arrayLength,uVar3);
    local_288 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_280 = "";
    local_298 = &boost::unit_test::basic_cstring<char_const>::null;
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0xb9;
    file_07.m_begin = (iterator)&local_288;
    msg_07.m_end = pvVar5;
    msg_07.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_298,
               msg_07);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_390,TmpArray,
               (uchar *)&local_38,(allocator_type *)&local_3a0);
    arith_uint256V((arith_uint256 *)&c1L.super_base_uint<256U>,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_390);
    ::operator<<(&c2L.super_base_uint<256U>,(base_uint<256U> *)MaxL,arrayLength);
    rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         ::operator==(&c1L.super_base_uint<256U>,&c2L.super_base_uint<256U>);
    local_f8[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
    local_f0 = (element_type *)0x0;
    asStack_e8[0].pi_ = (sp_counted_base *)0x0;
    local_370._0_8_ =
         "arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (MaxL << i)";
    local_370.m_message.px = (element_type *)0xb6b9fc;
    local_d0 = (element_type *)((ulong)local_d0 & 0xffffffffffffff00);
    local_d8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
    sStack_c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_c0 = (vector<unsigned_char,std::allocator<unsigned_char>> *)&local_370;
    local_2a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_2a0 = "";
    pvVar4 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_f8,(lazy_ostream *)local_d8,1,0,WARN,_cVar8,
               (size_t)&local_2a8,0xb9);
    boost::detail::shared_count::~shared_count(asStack_e8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_390);
    base_uint<256U>::operator=(&TmpL.super_base_uint<256U>,(base_uint<256U> *)MaxL);
    base_uint<256U>::operator<<=(&TmpL.super_base_uint<256U>,arrayLength);
    local_2b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_2b0 = "";
    local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0xbb;
    file_08.m_begin = (iterator)&local_2b8;
    msg_08.m_end = pvVar5;
    msg_08.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2c8,
               msg_08);
    ::operator<<(&c1L.super_base_uint<256U>,(base_uint<256U> *)MaxL,arrayLength);
    bVar2 = ::operator==(&TmpL.super_base_uint<256U>,&c1L.super_base_uint<256U>);
    local_d8[0] = bVar2;
    local_d0 = (element_type *)0x0;
    sStack_c8.pi_ = (sp_counted_base *)0x0;
    local_f8 = (undefined1  [8])0xb6b9fd;
    local_f0 = (element_type *)0xb6ba10;
    c2L.super_base_uint<256U>.pn[2]._0_1_ = 0;
    c2L.super_base_uint<256U>.pn._0_8_ = &PTR__lazy_ostream_011481f0;
    c2L.super_base_uint<256U>.pn._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_2d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_2d0 = "";
    pvVar4 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    uVar3 = 0xbb;
    c2L.super_base_uint<256U>.pn._24_8_ = (assertion_result *)local_f8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_d8,(lazy_ostream *)&c2L,1,0,WARN,_cVar8,(size_t)&local_2d8,
               0xbb);
    boost::detail::shared_count::~shared_count(&sStack_c8);
    shiftArrayRight(TmpArray,&MaxArray,arrayLength,uVar3);
    local_2e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_2e0 = "";
    local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0xbe;
    file_09.m_begin = (iterator)&local_2e8;
    msg_09.m_end = pvVar5;
    msg_09.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2f8,
               msg_09);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_390,TmpArray,
               (uchar *)&local_38,(allocator_type *)&local_3a0);
    arith_uint256V((arith_uint256 *)&c1L.super_base_uint<256U>,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_390);
    ::operator>>(&c2L.super_base_uint<256U>,(base_uint<256U> *)MaxL,arrayLength);
    rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         ::operator==(&c1L.super_base_uint<256U>,&c2L.super_base_uint<256U>);
    local_f8[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
    local_f0 = (element_type *)0x0;
    asStack_e8[0].pi_ = (sp_counted_base *)0x0;
    local_370._0_8_ =
         "arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (MaxL >> i)";
    local_370.m_message.px = (element_type *)0xb6ba60;
    local_d0 = (element_type *)((ulong)local_d0 & 0xffffffffffffff00);
    local_d8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
    sStack_c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_c0 = (vector<unsigned_char,std::allocator<unsigned_char>> *)&local_370;
    local_308 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_300 = "";
    pvVar4 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_f8,(lazy_ostream *)local_d8,1,0,WARN,_cVar8,
               (size_t)&local_308,0xbe);
    boost::detail::shared_count::~shared_count(asStack_e8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_390);
    base_uint<256U>::operator=(&TmpL.super_base_uint<256U>,(base_uint<256U> *)MaxL);
    base_uint<256U>::operator>>=(&TmpL.super_base_uint<256U>,arrayLength);
    local_318 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_310 = "";
    local_328 = &boost::unit_test::basic_cstring<char_const>::null;
    local_320 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0xc0;
    file_10.m_begin = (iterator)&local_318;
    msg_10.m_end = pvVar5;
    msg_10.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_328,
               msg_10);
    ::operator>>(&c1L.super_base_uint<256U>,(base_uint<256U> *)MaxL,arrayLength);
    bVar2 = ::operator==(&TmpL.super_base_uint<256U>,&c1L.super_base_uint<256U>);
    local_d8[0] = bVar2;
    local_d0 = (element_type *)0x0;
    sStack_c8.pi_ = (sp_counted_base *)0x0;
    local_f8 = (undefined1  [8])0xb6c678;
    local_f0 = (element_type *)0xb6c68b;
    c2L.super_base_uint<256U>.pn[2]._0_1_ = 0;
    c2L.super_base_uint<256U>.pn._0_8_ = &PTR__lazy_ostream_011481f0;
    c2L.super_base_uint<256U>.pn._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_330 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    in_RCX = 0xc0;
    c2L.super_base_uint<256U>.pn._24_8_ = (assertion_result *)local_f8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_d8,(lazy_ostream *)&c2L,1,0,WARN,_cVar8,(size_t)&local_338,
               0xc0);
    boost::detail::shared_count::~shared_count(&sStack_c8);
    shift = shift - 1;
  }
  base_uint<256U>::base_uint(&c1L.super_base_uint<256U>,0x123456789abcdef);
  local_3e8 = 0x80;
  ::operator<<((base_uint<256U> *)local_d8,&c1L.super_base_uint<256U>,0x80);
  base_uint<256U>::base_uint(&c2L.super_base_uint<256U>,(base_uint<256U> *)local_d8);
  iVar6 = 0;
  while (local_3e8 != 0) {
    local_348 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_340 = "";
    local_358 = &boost::unit_test::basic_cstring<char_const>::null;
    local_350 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0xc5;
    file_11.m_begin = (iterator)&local_348;
    msg_11.m_end = in_R9;
    msg_11.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_358,
               msg_11);
    ::operator<<((base_uint<256U> *)local_d8,&c1L.super_base_uint<256U>,iVar6);
    ::operator>>((base_uint<256U> *)local_f8,&c2L.super_base_uint<256U>,local_3e8);
    bVar2 = ::operator==((base_uint<256U> *)local_d8,(base_uint<256U> *)local_f8);
    local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar2;
    local_370.m_message.px = (element_type *)0x0;
    local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_3a0 = "(c1L << i) == (c2L >> (128-i))";
    local_398 = "";
    local_390._8_8_ = local_390._8_8_ & 0xffffffffffffff00;
    local_390._0_8_ = &PTR__lazy_ostream_011481f0;
    local_380 = boost::unit_test::lazy_ostream::inst;
    local_378 = &local_3a0;
    local_3b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_3a8 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_370,(lazy_ostream *)local_390,1,0,WARN,_cVar8,(size_t)&local_3b0,0xc5);
    boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
    iVar6 = iVar6 + 1;
    local_3e8 = local_3e8 + -1;
  }
  iVar7 = 0x80;
  iVar6 = 0x80;
  while (bVar2 = iVar7 != 0, iVar7 = iVar7 + -1, bVar2) {
    local_3c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_3b8 = "";
    local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0xc8;
    file_12.m_begin = (iterator)&local_3c0;
    msg_12.m_end = in_R9;
    msg_12.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3d0,
               msg_12);
    ::operator<<((base_uint<256U> *)local_d8,&c1L.super_base_uint<256U>,iVar6);
    ::operator<<((base_uint<256U> *)local_f8,&c2L.super_base_uint<256U>,iVar6 + -0x80);
    bVar2 = ::operator==((base_uint<256U> *)local_d8,(base_uint<256U> *)local_f8);
    local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar2;
    local_370.m_message.px = (element_type *)0x0;
    local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_3a0 = "(c1L << i) == (c2L << (i-128))";
    local_398 = "";
    local_390._8_8_ = local_390._8_8_ & 0xffffffffffffff00;
    local_390._0_8_ = &PTR__lazy_ostream_011481f0;
    local_380 = boost::unit_test::lazy_ostream::inst;
    local_378 = &local_3a0;
    local_3e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_3d8 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_370,(lazy_ostream *)local_390,1,0,WARN,_cVar8,(size_t)&local_3e0,200);
    boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
    iVar6 = iVar6 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE( shifts ) { // "<<"  ">>"  "<<="  ">>="
    unsigned char TmpArray[32];
    arith_uint256 TmpL;
    for (unsigned int i = 0; i < 256; ++i)
    {
        shiftArrayLeft(TmpArray, OneArray, 32, i);
        BOOST_CHECK(arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (OneL << i));
        TmpL = OneL; TmpL <<= i;
        BOOST_CHECK(TmpL == (OneL << i));
        BOOST_CHECK((HalfL >> (255-i)) == (OneL << i));
        TmpL = HalfL; TmpL >>= (255-i);
        BOOST_CHECK(TmpL == (OneL << i));

        shiftArrayLeft(TmpArray, R1Array, 32, i);
        BOOST_CHECK(arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (R1L << i));
        TmpL = R1L; TmpL <<= i;
        BOOST_CHECK(TmpL == (R1L << i));

        shiftArrayRight(TmpArray, R1Array, 32, i);
        BOOST_CHECK(arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (R1L >> i));
        TmpL = R1L; TmpL >>= i;
        BOOST_CHECK(TmpL == (R1L >> i));

        shiftArrayLeft(TmpArray, MaxArray, 32, i);
        BOOST_CHECK(arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (MaxL << i));
        TmpL = MaxL; TmpL <<= i;
        BOOST_CHECK(TmpL == (MaxL << i));

        shiftArrayRight(TmpArray, MaxArray, 32, i);
        BOOST_CHECK(arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (MaxL >> i));
        TmpL = MaxL; TmpL >>= i;
        BOOST_CHECK(TmpL == (MaxL >> i));
    }
    arith_uint256 c1L = arith_uint256(0x0123456789abcdefULL);
    arith_uint256 c2L = c1L << 128;
    for (unsigned int i = 0; i < 128; ++i) {
        BOOST_CHECK((c1L << i) == (c2L >> (128-i)));
    }
    for (unsigned int i = 128; i < 256; ++i) {
        BOOST_CHECK((c1L << i) == (c2L << (i-128)));
    }
}